

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O1

int UpnpGetHttpResponse(void *handle,UpnpString *headers,char **contentType,int *contentLength,
                       int *httpStatus,int timeout)

{
  http_parser_t *parser;
  bool bVar1;
  int iVar2;
  parse_status_t pVar3;
  http_header_t *phVar4;
  int iVar5;
  int iStack_48;
  int iStack_44;
  memptr mStack_40;
  
  parser = (http_parser_t *)((long)handle + 0x90);
  iStack_44 = timeout;
  iVar2 = ReadResponseLineAndHeaders((SOCKINFO *)handle,parser,&iStack_44,&iStack_48);
  iVar5 = -0x71;
  if (iVar2 == 4) {
    pVar3 = parser_get_entity_read_method(parser);
    if ((pVar3 == PARSE_CONTINUE_1) || (pVar3 == PARSE_SUCCESS)) {
      if (httpStatus != (int *)0x0) {
        *httpStatus = *(int *)((long)handle + 0x16c);
      }
      if (contentType != (char **)0x0) {
        phVar4 = httpmsg_find_hdr((http_message_t *)parser,4,&mStack_40);
        if (phVar4 != (http_header_t *)0x0) {
          phVar4 = (http_header_t *)mStack_40.buf;
        }
        *contentType = (char *)phVar4;
      }
      bVar1 = true;
      if (contentLength == (int *)0x0) {
LAB_0010f296:
        iVar5 = 0;
      }
      else {
        iVar5 = 0;
        iVar2 = 0;
        if (*(int *)((long)handle + 0x248) != 4) {
          iVar2 = *(int *)((long)handle + 0x24c);
          if (iVar2 == 4) {
            iVar2 = -4;
          }
          else if (iVar2 == 3) {
            iVar2 = -3;
          }
          else {
            if (iVar2 != 2) goto LAB_0010f296;
            iVar2 = *(int *)((long)handle + 0x250);
          }
        }
        *contentLength = iVar2;
      }
      goto LAB_0010f25a;
    }
  }
  bVar1 = false;
LAB_0010f25a:
  if (!bVar1) {
    httpmsg_destroy((http_message_t *)parser);
  }
  return iVar5;
}

Assistant:

int UpnpGetHttpResponse(void *handle,
	UpnpString *headers,
	char **contentType,
	int *contentLength,
	int *httpStatus,
	int timeout)
{
	return http_GetHttpResponse(handle,
		headers,
		contentType,
		contentLength,
		httpStatus,
		timeout);
}